

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

char * Ses_ManFindMinimumSizeBottomUp(Ses_Man_t *pSes)

{
  int iVar1;
  int iVar2;
  char *local_20;
  char *pSol;
  int fRes;
  int nGates;
  Ses_Man_t *pSes_local;
  
  pSol._4_4_ = pSes->nStartGates;
  local_20 = (char *)0x0;
  pSes->fHitResLimit = 0;
  iVar2 = 2;
  if (9 < pSes->nMaxGates) {
    iVar2 = 3;
  }
  pSes->nDebugOffset = iVar2;
  _fRes = pSes;
  iVar1 = Vec_IntSize(pSes->vStairDecVars);
  iVar2 = pSol._4_4_;
  if (iVar1 != 0) {
    iVar1 = Vec_IntSize(_fRes->vStairDecVars);
    pSol._4_4_ = Abc_MaxInt(iVar2,iVar1 + -1);
  }
  memset(_fRes->pTtValues,0,0x20);
  Abc_DebugPrintIntInt(" (%d/%d)",pSol._4_4_,_fRes->nMaxGates,_fRes->fVeryVerbose);
  while( true ) {
    pSol._4_4_ = pSol._4_4_ + 1;
    pSol._0_4_ = Ses_ManFindNetworkExactCEGAR(_fRes,pSol._4_4_,&local_20);
    if ((int)pSol == 0) break;
    if (((int)pSol == 1) || ((int)pSol == 3)) goto LAB_00307449;
  }
  _fRes->fHitResLimit = 1;
LAB_00307449:
  iVar2 = 4;
  if (9 < pSol._4_4_) {
    iVar2 = 5;
  }
  Abc_DebugErase(_fRes->nDebugOffset + iVar2,_fRes->fVeryVerbose);
  return local_20;
}

Assistant:

static char * Ses_ManFindMinimumSizeBottomUp( Ses_Man_t * pSes )
{
    int nGates = pSes->nStartGates, fRes;
    char * pSol = NULL;

    /* store whether call was unsuccessful due to resource limit and not due to impossible constraint */
    pSes->fHitResLimit = 0;

    pSes->nDebugOffset = pSes->nMaxGates >= 10 ? 3 : 2;

    /* adjust number of gates if there is a stair decomposition */
    if ( Vec_IntSize( pSes->vStairDecVars ) )
        nGates = Abc_MaxInt( nGates, Vec_IntSize( pSes->vStairDecVars ) - 1 );

    //Ses_ManStoreDepthAndArrivalTimes( pSes );

    memset( pSes->pTtValues, 0, 4 * sizeof( word ) );

    Abc_DebugPrintIntInt( " (%d/%d)", nGates, pSes->nMaxGates, pSes->fVeryVerbose );

    while ( true )
    {
        ++nGates;

        fRes = Ses_ManFindNetworkExactCEGAR( pSes, nGates, &pSol );

        if ( fRes == 0 )
        {
            pSes->fHitResLimit = 1;
            break;
        }
        else if ( fRes == 1 || fRes == 3 )
            break;
    }

    Abc_DebugErase( pSes->nDebugOffset + ( nGates >= 10 ? 5 : 4 ), pSes->fVeryVerbose );

    return pSol;
}